

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

Matrix3d *
opengv::relative_pose::modules::eigensolver::composeMwithJacobians
          (Matrix3d *xxF,Matrix3d *yyF,Matrix3d *zzF,Matrix3d *xyF,Matrix3d *yzF,Matrix3d *zxF,
          cayley_t *cayley,Matrix3d *M_jac1,Matrix3d *M_jac2,Matrix3d *M_jac3)

{
  double dVar1;
  Scalar SVar2;
  CoeffReturnType pdVar3;
  Scalar *pSVar4;
  Matrix3d *in_RDI;
  Scalar SVar5;
  Scalar SVar6;
  Scalar SVar7;
  double temp;
  rotation_t R_jac3;
  rotation_t R_jac2;
  rotation_t R_jac1;
  rotation_t R;
  Matrix3d *M;
  Index in_stack_ffffffffffff4628;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *in_stack_ffffffffffff4630;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *this;
  MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *other;
  DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this_00;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
  *this_01;
  dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
  *this_02;
  StorageBaseType *matrix;
  double *scalar;
  cayley_t *in_stack_ffffffffffff4708;
  
  math::cayley2rot_reduced(in_stack_ffffffffffff4708);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1242474);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1242481);
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x124248e);
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     (in_stack_ffffffffffff4630,in_stack_ffffffffffff4628);
  this = (DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1> *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12424c5);
  *pSVar4 = (Scalar)this;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  other = (MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242509);
  *pSVar4 = (Scalar)other;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  this_00 = (DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124254d);
  *pSVar4 = (Scalar)this_00;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  this_01 = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
             *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242591);
  *pSVar4 = (Scalar)this_01;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12425d3);
  *pSVar4 = dVar1 * -2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12425f4);
  *pSVar4 = -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124263a);
  *pSVar4 = dVar1 * 2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124265b);
  *pSVar4 = 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  this_02 = (dense_product_base<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
             *)(*pdVar3 * -2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124269f);
  *pSVar4 = (Scalar)this_02;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12426e1);
  *pSVar4 = dVar1 * -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  matrix = (StorageBaseType *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242724);
  *pSVar4 = (Scalar)matrix;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242744);
  *pSVar4 = 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  scalar = (double *)(*pdVar3 * 2.0);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242789);
  *pSVar4 = (Scalar)scalar;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12427cc);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242811);
  *pSVar4 = dVar1 * 2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242831);
  *pSVar4 = -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242878);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12428bb);
  *pSVar4 = dVar1 * -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12428fd);
  *pSVar4 = dVar1 * -2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124291d);
  *pSVar4 = -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242965);
  *pSVar4 = dVar1 * 2.0;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242988);
  *pSVar4 = 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12429d0);
  *pSVar4 = dVar1 * -2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242a1b);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242a64);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242aaf);
  *pSVar4 = dVar1 * 2.0;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> *)this,
                      in_stack_ffffffffffff4628);
  dVar1 = *pdVar3;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242af8);
  *pSVar4 = dVar1 * 2.0;
  Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix((Matrix<double,_3,_3,_0,_3,_3> *)0x1242b12);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242bd1);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242ccb);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242d9b);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242e99);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1242f93);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243091);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124318f);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124328d);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243387);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243485);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243583);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243681);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124377b);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243879);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243977);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243a48);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243b44);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243c43);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243d15);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243de6);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243eb3);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1243fb3);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244099);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124417f);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244251);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244323);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12443f4);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12444c1);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12445c1);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12446a7);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124478d);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124485f);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244931);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244a02);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244acf);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244bcf);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244cb5);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244d9b);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244e6d);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1244f3f);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245011);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124510c);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124520c);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12452dd);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12453af);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124547d);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245563);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245649);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245749);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124581a);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12458eb);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12459bd);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245a8b);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245b71);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245c57);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245d57);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245e28);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245ef9);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1245fcb);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246099);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124617f);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246265);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246365);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246436);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246507);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12465d6);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12466d0);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12467a1);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124689e);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246998);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246a96);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246b95);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246c92);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246d8c);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246e8a);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1246f89);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247086);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247180);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124727e);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124737d);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124744f);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124754a);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124764b);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124771d);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12477ef);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12478bd);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12479bc);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247aa4);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247b8c);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247c5e);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247d30);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247e02);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247ed0);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1247fcf);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12480b7);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124819f);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248271);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248343);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248415);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12484e3);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12485e2);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12486ca);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::operator-
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_01)
  ;
  Eigen::
  MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*((MatrixBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar7 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12487b2);
  *pSVar4 = SVar7 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248884);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248956);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248a27);
  *pSVar4 = SVar5;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248b21);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>>::operator*
            ((MatrixBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this_00
             ,other);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_00,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)other);
  SVar5 = Eigen::internal::dense_product_base::operator_cast_to_double(this_02);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248bf0);
  *pSVar4 = SVar5 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248cef);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248de9);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248ee7);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1248fe4);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12490e3);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12491dd);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12492db);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12493d8);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12494d7);
  *pSVar4 = SVar6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12495d1);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12496cf);
  *pSVar4 = SVar6 + *pSVar4;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::operator*(scalar,matrix);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>>
  ::operator*(this_01,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)this_00);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::row(this_00,(Index)other);
  Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>::transpose
            ((DenseBase<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_> *)this);
  Eigen::
  MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,3,1,1,3>const>const,Eigen::Block<Eigen::Matrix<double,3,3,0,3,3>,1,3,false>const>,Eigen::Matrix<double,3,3,0,3,3>,0>>
  ::operator*((MatrixBase<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>_>
               *)this_01,
              (MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>_>
               *)this_00);
  SVar6 = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,_3,_1,_1,_3>_>,_const_Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>,_0>,_Eigen::Transpose<Eigen::Block<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1,_3,_false>_>,_0,_6>
                      *)this_00);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12497cc);
  *pSVar4 = SVar6 + *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12497f3);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249816);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249839);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124985c);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249880);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12498a4);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12498c7);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12498ea);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124990d);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249930);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249954);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249978);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x124999b);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12499be);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x12499e1);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249a04);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249a28);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249a4c);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249a6f);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249a92);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249ab5);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249ad8);
  *pSVar4 = SVar2;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249afc);
  SVar2 = *pSVar4;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_1>::operator()
                     (this,in_stack_ffffffffffff4628,0x1249b20);
  *pSVar4 = SVar2;
  return in_RDI;
}

Assistant:

Eigen::Matrix3d
opengv::relative_pose::modules::eigensolver::composeMwithJacobians(
    const Eigen::Matrix3d & xxF,
    const Eigen::Matrix3d & yyF,
    const Eigen::Matrix3d & zzF,
    const Eigen::Matrix3d & xyF,
    const Eigen::Matrix3d & yzF,
    const Eigen::Matrix3d & zxF,
    const cayley_t & cayley,
    Eigen::Matrix3d & M_jac1,
    Eigen::Matrix3d & M_jac2,
    Eigen::Matrix3d & M_jac3 )
{
  rotation_t R = math::cayley2rot_reduced(cayley);
  rotation_t R_jac1;
  rotation_t R_jac2;
  rotation_t R_jac3;

  R_jac1(0,0) = 2*cayley[0];
  R_jac1(0,1) = 2*cayley[1];
  R_jac1(0,2) = 2*cayley[2];
  R_jac1(1,0) = 2*cayley[1];
  R_jac1(1,1) = -2*cayley[0];
  R_jac1(1,2) = -2;
  R_jac1(2,0) = 2*cayley[2];
  R_jac1(2,1) = 2;
  R_jac1(2,2) = -2*cayley[0];
  R_jac2(0,0) = -2*cayley[1];
  R_jac2(0,1) = 2*cayley[0];
  R_jac2(0,2) = 2;
  R_jac2(1,0) = 2*cayley[0];
  R_jac2(1,1) = 2*cayley[1];
  R_jac2(1,2) = 2*cayley[2];
  R_jac2(2,0) = -2;
  R_jac2(2,1) = 2*cayley[2];
  R_jac2(2,2) = -2*cayley[1];
  R_jac3(0,0) = -2*cayley[2];
  R_jac3(0,1) = -2;
  R_jac3(0,2) = 2*cayley[0];
  R_jac3(1,0) = 2;
  R_jac3(1,1) = -2*cayley[2];
  R_jac3(1,2) = 2*cayley[1];
  R_jac3(2,0) = 2*cayley[0];
  R_jac3(2,1) = 2*cayley[1];
  R_jac3(2,2) = 2*cayley[2];

  //Fill the matrix M using the precomputed summation terms. Plus Jacobian.
  Eigen::Matrix3d M;
  double temp;
  temp =      R.row(2)*yyF*R.row(2).transpose();
  M(0,0)  = temp;
  temp = -2.0*R.row(2)*yzF*R.row(1).transpose();
  M(0,0) += temp;
  temp =      R.row(1)*zzF*R.row(1).transpose();
  M(0,0) += temp;
  temp = 2.0*R_jac1.row(2)*yyF*R.row(2).transpose();
  M_jac1(0,0)  = temp;
  temp = -2.0*R_jac1.row(2)*yzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac1.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac1.row(1)*zzF*R.row(1).transpose();
  M_jac1(0,0) += temp;
  temp = 2.0*R_jac2.row(2)*yyF*R.row(2).transpose();
  M_jac2(0,0)  = temp;
  temp = -2.0*R_jac2.row(2)*yzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac2.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac2.row(1)*zzF*R.row(1).transpose();
  M_jac2(0,0) += temp;
  temp = 2.0*R_jac3.row(2)*yyF*R.row(2).transpose();
  M_jac3(0,0)  = temp;
  temp = -2.0*R_jac3.row(2)*yzF*R.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = -2.0*R.row(2)*yzF*R_jac3.row(1).transpose();
  M_jac3(0,0) += temp;
  temp = 2.0*R_jac3.row(1)*zzF*R.row(1).transpose();
  M_jac3(0,0) += temp;

  temp =      R.row(2)*yzF*R.row(0).transpose();
  M(0,1)  = temp;
  temp = -1.0*R.row(2)*xyF*R.row(2).transpose();
  M(0,1) += temp;
  temp = -1.0*R.row(1)*zzF*R.row(0).transpose();
  M(0,1) += temp;
  temp =      R.row(1)*zxF*R.row(2).transpose();
  M(0,1) += temp;
  temp = R_jac1.row(2)*yzF*R.row(0).transpose();
  M_jac1(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -2.0*R_jac1.row(2)*xyF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = -R_jac1.row(1)*zzF*R.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac1.row(0).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac1.row(1)*zxF*R.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R.row(1)*zxF*R_jac1.row(2).transpose();
  M_jac1(0,1) += temp;
  temp = R_jac2.row(2)*yzF*R.row(0).transpose();
  M_jac2(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -2.0*R_jac2.row(2)*xyF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = -R_jac2.row(1)*zzF*R.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac2.row(0).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac2.row(1)*zxF*R.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R.row(1)*zxF*R_jac2.row(2).transpose();
  M_jac2(0,1) += temp;
  temp = R_jac3.row(2)*yzF*R.row(0).transpose();
  M_jac3(0,1)  = temp;
  temp = R.row(2)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -2.0*R_jac3.row(2)*xyF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = -R_jac3.row(1)*zzF*R.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = -R.row(1)*zzF*R_jac3.row(0).transpose();
  M_jac3(0,1) += temp;
  temp = R_jac3.row(1)*zxF*R.row(2).transpose();
  M_jac3(0,1) += temp;
  temp = R.row(1)*zxF*R_jac3.row(2).transpose();
  M_jac3(0,1) += temp;

  temp =      R.row(2)*xyF*R.row(1).transpose();
  M(0,2)  = temp;
  temp = -1.0*R.row(2)*yyF*R.row(0).transpose();
  M(0,2) += temp;
  temp = -1.0*R.row(1)*zxF*R.row(1).transpose();
  M(0,2) += temp;
  temp =      R.row(1)*yzF*R.row(0).transpose();
  M(0,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(1).transpose();
  M_jac1(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac1.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = -R_jac1.row(2)*yyF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = -2.0*R_jac1.row(1)*zxF*R.row(1).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac1.row(1)*yzF*R.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R.row(1)*yzF*R_jac1.row(0).transpose();
  M_jac1(0,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(1).transpose();
  M_jac2(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac2.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = -R_jac2.row(2)*yyF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = -2.0*R_jac2.row(1)*zxF*R.row(1).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac2.row(1)*yzF*R.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R.row(1)*yzF*R_jac2.row(0).transpose();
  M_jac2(0,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(1).transpose();
  M_jac3(0,2)  = temp;
  temp = R.row(2)*xyF*R_jac3.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = -R_jac3.row(2)*yyF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -R.row(2)*yyF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = -2.0*R_jac3.row(1)*zxF*R.row(1).transpose();
  M_jac3(0,2) += temp;
  temp = R_jac3.row(1)*yzF*R.row(0).transpose();
  M_jac3(0,2) += temp;
  temp = R.row(1)*yzF*R_jac3.row(0).transpose();
  M_jac3(0,2) += temp;

  temp =      R.row(0)*zzF*R.row(0).transpose();
  M(1,1)  = temp;
  temp = -2.0*R.row(0)*zxF*R.row(2).transpose();
  M(1,1) += temp;
  temp =      R.row(2)*xxF*R.row(2).transpose();
  M(1,1) += temp;
  temp = 2.0*R_jac1.row(0)*zzF*R.row(0).transpose();
  M_jac1(1,1)  = temp;
  temp = -2.0*R_jac1.row(0)*zxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac1.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac1.row(2)*xxF*R.row(2).transpose();
  M_jac1(1,1) += temp;
  temp = 2.0*R_jac2.row(0)*zzF*R.row(0).transpose();
  M_jac2(1,1)  = temp;
  temp = -2.0*R_jac2.row(0)*zxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac2.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac2.row(2)*xxF*R.row(2).transpose();
  M_jac2(1,1) += temp;
  temp = 2.0*R_jac3.row(0)*zzF*R.row(0).transpose();
  M_jac3(1,1)  = temp;
  temp = -2.0*R_jac3.row(0)*zxF*R.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = -2.0*R.row(0)*zxF*R_jac3.row(2).transpose();
  M_jac3(1,1) += temp;
  temp = 2.0*R_jac3.row(2)*xxF*R.row(2).transpose();
  M_jac3(1,1) += temp;

  temp =      R.row(0)*zxF*R.row(1).transpose();
  M(1,2)  = temp;
  temp = -1.0*R.row(0)*yzF*R.row(0).transpose();
  M(1,2) += temp;
  temp = -1.0*R.row(2)*xxF*R.row(1).transpose();
  M(1,2) += temp;
  temp =      R.row(2)*xyF*R.row(0).transpose();
  M(1,2) += temp;
  temp = R_jac1.row(0)*zxF*R.row(1).transpose();
  M_jac1(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -2.0*R_jac1.row(0)*yzF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = -R_jac1.row(2)*xxF*R.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac1.row(1).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac1.row(2)*xyF*R.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R.row(2)*xyF*R_jac1.row(0).transpose();
  M_jac1(1,2) += temp;
  temp = R_jac2.row(0)*zxF*R.row(1).transpose();
  M_jac2(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -2.0*R_jac2.row(0)*yzF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = -R_jac2.row(2)*xxF*R.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac2.row(1).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac2.row(2)*xyF*R.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R.row(2)*xyF*R_jac2.row(0).transpose();
  M_jac2(1,2) += temp;
  temp = R_jac3.row(0)*zxF*R.row(1).transpose();
  M_jac3(1,2)  = temp;
  temp = R.row(0)*zxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -2.0*R_jac3.row(0)*yzF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = -R_jac3.row(2)*xxF*R.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = -R.row(2)*xxF*R_jac3.row(1).transpose();
  M_jac3(1,2) += temp;
  temp = R_jac3.row(2)*xyF*R.row(0).transpose();
  M_jac3(1,2) += temp;
  temp = R.row(2)*xyF*R_jac3.row(0).transpose();
  M_jac3(1,2) += temp;

  temp =      R.row(1)*xxF*R.row(1).transpose();
  M(2,2)  = temp;
  temp = -2.0*R.row(0)*xyF*R.row(1).transpose();
  M(2,2) += temp;
  temp =      R.row(0)*yyF*R.row(0).transpose();
  M(2,2) += temp;
  temp = 2.0*R_jac1.row(1)*xxF*R.row(1).transpose();
  M_jac1(2,2)  = temp;
  temp = -2.0*R_jac1.row(0)*xyF*R.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac1.row(1).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac1.row(0)*yyF*R.row(0).transpose();
  M_jac1(2,2) += temp;
  temp = 2.0*R_jac2.row(1)*xxF*R.row(1).transpose();
  M_jac2(2,2)  = temp;
  temp = -2.0*R_jac2.row(0)*xyF*R.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac2.row(1).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac2.row(0)*yyF*R.row(0).transpose();
  M_jac2(2,2) += temp;
  temp = 2.0*R_jac3.row(1)*xxF*R.row(1).transpose();
  M_jac3(2,2)  = temp;
  temp = -2.0*R_jac3.row(0)*xyF*R.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = -2.0*R.row(0)*xyF*R_jac3.row(1).transpose();
  M_jac3(2,2) += temp;
  temp = 2.0*R_jac3.row(0)*yyF*R.row(0).transpose();
  M_jac3(2,2) += temp;

  M(1,0) = M(0,1);
  M(2,0) = M(0,2);
  M(2,1) = M(1,2);
  M_jac1(1,0) = M_jac1(0,1);
  M_jac1(2,0) = M_jac1(0,2);
  M_jac1(2,1) = M_jac1(1,2);
  M_jac2(1,0) = M_jac2(0,1);
  M_jac2(2,0) = M_jac2(0,2);
  M_jac2(2,1) = M_jac2(1,2);
  M_jac3(1,0) = M_jac3(0,1);
  M_jac3(2,0) = M_jac3(0,2);
  M_jac3(2,1) = M_jac3(1,2);

  return M;
}